

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void in_memory_snapshot_cleanup_test(void)

{
  fdb_file_handle *fhandle;
  void *key;
  size_t metalen;
  fdb_seqnum_t unaff_retaddr;
  fdb_kvs_handle **in_stack_00000008;
  fdb_kvs_handle *in_stack_00000010;
  char newKey [32];
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [32];
  char metabuf [32];
  char keybuf [32];
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc *doc;
  fdb_kvs_handle *psnap_db3;
  fdb_kvs_handle *psnap_db2;
  fdb_kvs_handle *psnap_db1;
  fdb_kvs_handle *snap_db3;
  fdb_kvs_handle *snap_db2;
  fdb_kvs_handle *snap_db1;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int r;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle **in_stack_fffffffffffffd58;
  fdb_kvs_handle *handle;
  fdb_file_handle *in_stack_fffffffffffffd60;
  char *meta;
  size_t in_stack_fffffffffffffd68;
  char *keylen;
  void *in_stack_fffffffffffffd70;
  fdb_doc **in_stack_fffffffffffffd78;
  fdb_doc **doc_00;
  char *bodylen;
  char local_248 [72];
  undefined8 local_200;
  undefined4 local_1ec;
  undefined1 local_1e1;
  undefined8 local_158;
  char local_118 [32];
  fdb_doc *local_f8 [4];
  char local_d8 [44];
  fdb_status local_ac;
  fdb_doc *local_a8;
  fdb_doc *local_a0;
  fdb_config *in_stack_ffffffffffffff78;
  fdb_kvs_handle *in_stack_ffffffffffffff80;
  fdb_kvs_handle *in_stack_ffffffffffffff88;
  fdb_kvs_handle *local_70;
  fdb_kvs_handle *local_68;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  memleak_start();
  local_a0 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_200 = 0x400;
  local_1ec = 1;
  local_1e1 = 0;
  local_158 = 0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  local_ac = fdb_open((fdb_file_handle **)in_stack_ffffffffffffff88,
                      (char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (local_ac != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x464);
    in_memory_snapshot_cleanup_test::__test_pass = 0;
    if (local_ac != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x464,"void in_memory_snapshot_cleanup_test()");
    }
  }
  local_ac = fdb_kvs_open_default
                       (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                        (fdb_kvs_config *)0x10a5b9);
  if (local_ac != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x466);
    in_memory_snapshot_cleanup_test::__test_pass = 0;
    if (local_ac != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x466,"void in_memory_snapshot_cleanup_test()");
    }
  }
  local_ac = fdb_set_log_callback(local_68,logCallbackFunc,"in_memory_snapshot_cleanup_test");
  if (local_ac != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x46a);
    in_memory_snapshot_cleanup_test::__test_pass = 0;
    if (local_ac != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x46a,"void in_memory_snapshot_cleanup_test()");
    }
  }
  sprintf(local_d8,"key");
  sprintf((char *)local_f8,"meta");
  sprintf(local_118,"body");
  bodylen = local_d8;
  strlen(local_d8);
  strlen((char *)local_f8);
  fhandle = (fdb_file_handle *)strlen(local_118);
  fdb_doc_create(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                 in_stack_fffffffffffffd60,(size_t)fhandle,(void *)0x10a770,(size_t)bodylen);
  fdb_set(local_68,local_a0);
  fdb_commit(fhandle,'\0');
  local_ac = fdb_snapshot_open(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  if (local_ac != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x477);
    in_memory_snapshot_cleanup_test::__test_pass = 0;
    if (local_ac != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x477,"void in_memory_snapshot_cleanup_test()");
    }
  }
  local_ac = fdb_set(local_68,local_a0);
  if (local_ac != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x47a);
    in_memory_snapshot_cleanup_test::__test_pass = 0;
    if (local_ac != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x47a,"void in_memory_snapshot_cleanup_test()");
    }
  }
  local_ac = fdb_commit(fhandle,'\0');
  if (local_ac != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x47e);
    in_memory_snapshot_cleanup_test::__test_pass = 0;
    if (local_ac != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x47e,"void in_memory_snapshot_cleanup_test()");
    }
  }
  local_ac = fdb_snapshot_open(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  if (local_ac != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x481);
    in_memory_snapshot_cleanup_test::__test_pass = 0;
    if (local_ac != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x481,"void in_memory_snapshot_cleanup_test()");
    }
  }
  local_ac = fdb_set(local_68,local_a0);
  if (local_ac != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x484);
    in_memory_snapshot_cleanup_test::__test_pass = 0;
    if (local_ac != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x484,"void in_memory_snapshot_cleanup_test()");
    }
  }
  local_ac = fdb_commit(fhandle,'\0');
  if (local_ac != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x488);
    in_memory_snapshot_cleanup_test::__test_pass = 0;
    if (local_ac != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x488,"void in_memory_snapshot_cleanup_test()");
    }
  }
  local_ac = fdb_set(local_68,local_a0);
  if (local_ac != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x48b);
    in_memory_snapshot_cleanup_test::__test_pass = 0;
    if (local_ac != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x48b,"void in_memory_snapshot_cleanup_test()");
    }
  }
  local_ac = fdb_commit(fhandle,'\0');
  if (local_ac != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x48f);
    in_memory_snapshot_cleanup_test::__test_pass = 0;
    if (local_ac != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x48f,"void in_memory_snapshot_cleanup_test()");
    }
  }
  fdb_doc_free((fdb_doc *)0x10aba5);
  sprintf(local_248,"Key");
  keylen = local_248;
  key = (void *)strlen(local_248);
  doc_00 = local_f8;
  strlen((char *)local_f8);
  metalen = strlen(local_118);
  fdb_doc_create(doc_00,key,(size_t)keylen,in_stack_fffffffffffffd60,metalen,(void *)0x10ac34,
                 (size_t)bodylen);
  fdb_set(local_68,local_a0);
  local_ac = fdb_snapshot_open(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  if (local_ac != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x49b);
    in_memory_snapshot_cleanup_test::__test_pass = 0;
    if (local_ac != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x49b,"void in_memory_snapshot_cleanup_test()");
    }
  }
  meta = local_d8;
  strlen(local_d8);
  handle = (fdb_kvs_handle *)0x0;
  fdb_doc_create(doc_00,key,(size_t)keylen,meta,0,(void *)0x10ad13,(size_t)bodylen);
  local_ac = fdb_get(local_70,local_a8);
  if (local_ac != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x4a0);
    in_memory_snapshot_cleanup_test::__test_pass = 0;
    if (local_ac != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x4a0,"void in_memory_snapshot_cleanup_test()");
    }
  }
  local_ac = fdb_get(in_stack_ffffffffffffff88,local_a8);
  if (local_ac != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x4a3);
    in_memory_snapshot_cleanup_test::__test_pass = 0;
    if (local_ac != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x4a3,"void in_memory_snapshot_cleanup_test()");
    }
  }
  local_ac = fdb_get(in_stack_ffffffffffffff80,local_a8);
  if (local_ac != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x4a6);
    in_memory_snapshot_cleanup_test::__test_pass = 0;
    if (local_ac != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x4a6,"void in_memory_snapshot_cleanup_test()");
    }
  }
  fdb_doc_free((fdb_doc *)0x10aea3);
  local_ac = fdb_snapshot_open(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  if (local_ac != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x4ab);
    in_memory_snapshot_cleanup_test::__test_pass = 0;
    if (local_ac != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x4ab,"void in_memory_snapshot_cleanup_test()");
    }
  }
  local_ac = fdb_snapshot_open(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  if (local_ac != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x4ae);
    in_memory_snapshot_cleanup_test::__test_pass = 0;
    if (local_ac != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x4ae,"void in_memory_snapshot_cleanup_test()");
    }
  }
  local_ac = fdb_snapshot_open(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  if (local_ac != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x4b1);
    in_memory_snapshot_cleanup_test::__test_pass = 0;
    if (local_ac != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x4b1,"void in_memory_snapshot_cleanup_test()");
    }
  }
  fdb_kvs_close(handle);
  fdb_kvs_close(handle);
  fdb_kvs_close(handle);
  local_ac = fdb_commit((fdb_file_handle *)handle,'\0');
  if (local_ac != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x4ba);
    in_memory_snapshot_cleanup_test::__test_pass = 0;
    if (local_ac != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x4ba,"void in_memory_snapshot_cleanup_test()");
    }
  }
  fdb_kvs_close(handle);
  fdb_kvs_close(handle);
  fdb_kvs_close(handle);
  fdb_kvs_close(handle);
  fdb_close((fdb_file_handle *)handle);
  fdb_doc_free((fdb_doc *)0x10b128);
  fdb_shutdown();
  memleak_end();
  if (in_memory_snapshot_cleanup_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","in-memory snapshot cleanup test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","in-memory snapshot cleanup test");
  }
  return;
}

Assistant:

void in_memory_snapshot_cleanup_test()
{
    TEST_INIT();

    memleak_start();

    int r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_handle *snap_db1, *snap_db2, *snap_db3;
    fdb_kvs_handle *psnap_db1, *psnap_db2, *psnap_db3;
    fdb_doc *doc = NULL;
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[32], metabuf[32], bodybuf[32];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 0;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // open db
    status = fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "in_memory_snapshot_cleanup_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    sprintf(keybuf, "key");
    sprintf(metabuf, "meta");
    sprintf(bodybuf, "body");
    fdb_doc_create(&doc, (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
    fdb_set(db, doc);

    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    status = fdb_snapshot_open(db, &snap_db1, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set(db, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // commit without a WAL flush
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_snapshot_open(db, &snap_db2, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set(db, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // commit without a WAL flush
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set(db, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // commit without a WAL flush
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_doc_free(doc);

    // Update doc with new Key
    char newKey[32];
    sprintf(newKey, "Key");
    fdb_doc_create(&doc, (void*)newKey, strlen(newKey),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
    fdb_set(db, doc);

    status = fdb_snapshot_open(db, &snap_db3, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);

    status = fdb_get(snap_db1, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get(snap_db2, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get(snap_db3, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_doc_free(rdoc);

    status = fdb_snapshot_open(db, &psnap_db1, 1);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_snapshot_open(db, &psnap_db2, 2);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_snapshot_open(db, &psnap_db3, 3);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close snapshot handle
    fdb_kvs_close(snap_db1);
    fdb_kvs_close(snap_db2);
    fdb_kvs_close(snap_db3);

    // commit without a WAL flush
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_kvs_close(psnap_db1);
    fdb_kvs_close(psnap_db2);
    fdb_kvs_close(psnap_db3);

    // close db handle
    fdb_kvs_close(db);

    // close db file
    fdb_close(dbfile);

    fdb_doc_free(doc);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("in-memory snapshot cleanup test");
}